

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall ezexample::addns(ezexample *this,char c)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  undefined1 in_SIL;
  long in_RDI;
  features *in_stack_ffffffffffffff90;
  ezexample *in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffb8;
  vw *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = in_SIL;
  bVar1 = ensure_ns_exists(in_stack_ffffffffffffff98,
                           (char)((ulong)in_stack_ffffffffffffff90 >> 0x38));
  if (!bVar1) {
    features::clear(in_stack_ffffffffffffff90);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (in_stack_ffffffffffffffa0,(value_type_conflict *)in_stack_ffffffffffffff98);
    *(undefined1 *)(in_RDI + 0x54) = local_9;
    pcVar3 = (char *)(in_RDI + 0x11);
    *(undefined1 *)(in_RDI + 0x11) = local_9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar3,&local_31);
    uVar2 = VW::hash_space(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(int *)(in_RDI + 0x40) = (int)uVar2;
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void addns(char c)
  {
    if (ensure_ns_exists(c))
      return;

    ec->feature_space[(int)c].clear();
    past_seeds.push_back(current_seed);
    current_ns = c;
    str[0] = c;
    current_seed = VW::hash_space(*vw_ref, str);
  }